

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O2

void * __thiscall controller::findHandle(controller *this,string *key)

{
  bool bVar1;
  int *piVar2;
  string *this_00;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string tmp;
  robj okey;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  undefined4 local_30 [2];
  string *local_28;
  
  local_30[0] = 0;
  local_28 = key;
  piVar2 = (int *)dic::dictFetchValue(&this->dcdb,this->dictidx,local_30);
  if (piVar2 == (int *)0x0) {
    this_00 = (string *)0x0;
  }
  else {
    if (*piVar2 == 2) {
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(piVar2 + 2);
      while (bVar1 = std::operator!=(__lhs,""), bVar1) {
        __lhs = __lhs + 1;
        std::__cxx11::string::append((string *)&local_50);
      }
    }
    else {
      if (*piVar2 == 0) {
        return *(void **)(piVar2 + 2);
      }
      lVar3 = *(long *)(piVar2 + 2);
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      for (; lVar3 != 0; lVar3 = *(long *)(lVar3 + 8)) {
        std::__cxx11::string::append((string *)&local_50);
      }
    }
    this_00 = (string *)&local_50;
    std::__cxx11::string::~string(this_00);
  }
  return this_00;
}

Assistant:

void * controller::findHandle(std::string key){
    robj okey;
    okey.objtype=_string;
    okey.ptr=&key;
    void *fetch=NULL;
    void *result=NULL;
    fetch=controller::dcdb.dictFetchValue(controller::dictidx,&okey);
    if(fetch==NULL)
        return fetch;
    else if(((robj *)fetch)->objtype==_string)
        return ((robj *)fetch)->ptr;//consider to return string 
    else if (((robj *)fetch)->objtype==_set){
        std::string tmp;
        std::string *p=((std::string *)(((robj *)fetch)->ptr));
        while(*p++!="\0"){
            tmp+=*((std::string *)(((robj *)fetch)->ptr));
        }
        result=&tmp;
        return result;
    }
    else if(((robj *)fetch)->objtype==_list){
        listNode *p=(listNode *)(((robj *)fetch)->ptr);
        std::string tmp;
        while(p!=NULL){
            tmp+=*((std::string *)p->value);
            p=p->next;  
        }
        result=&tmp;
        return result;
    }
}